

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmStrCat<char_const(&)[14],std::__cxx11::string_const&,char>
                   (string *__return_storage_ptr__,char (*a) [14],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,char *args)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  char local_88 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_68;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  
  local_68.first._M_len = strlen(*a);
  local_68.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48 = (b->_M_dataplus)._M_p;
  local_50 = b->_M_string_length;
  local_40 = 0;
  local_88[0] = *args;
  local_30 = local_88;
  local_38 = 1;
  local_28 = 0;
  views._M_len = 3;
  views._M_array = &local_68;
  local_68.first._M_str = *a;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}